

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O0

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Currency *currency)

{
  bool bVar1;
  int iVar2;
  Currency *b;
  const_pointer pvVar3;
  const_pointer pvVar4;
  string *psVar5;
  long lVar6;
  jbcoin *pjVar7;
  size_t sVar8;
  int in_ECX;
  allocator<char> *__a;
  char *text;
  allocator<char> local_4a;
  byte local_49;
  undefined4 local_48;
  int isoOffset;
  allocator local_2e [21];
  allocator local_19;
  jbcoin *local_18;
  Currency *currency_local;
  string *iso;
  
  local_18 = this;
  currency_local = (Currency *)__return_storage_ptr__;
  if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
       allowed_characters_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                   ::allowed_characters_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                allowed_characters_abi_cxx11_,
               "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789<>(){}[]|?!@#$%^&*",
               &local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                  allowed_characters_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                         ::allowed_characters_abi_cxx11_);
  }
  bVar1 = beast::operator==(local_18);
  pjVar7 = local_18;
  if (bVar1) {
    psVar5 = systemCurrencyCode_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    b = noCurrency();
    bVar1 = operator==((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)pjVar7,b);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"1",local_2e);
      std::allocator<char>::~allocator((allocator<char> *)local_2e);
    }
    else {
      if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
           sIsoBits == '\0') &&
         (iVar2 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                       ::sIsoBits), iVar2 != 0)) {
        from_hex_text<jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>>
                  (&to_string::sIsoBits,(jbcoin *)"FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF",text);
        __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                             ::sIsoBits);
      }
      operator&((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)&stack0xffffffffffffffbc,
                (base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_18,&to_string::sIsoBits);
      bVar1 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::isZero
                        ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)&stack0xffffffffffffffbc);
      if (bVar1) {
        local_48 = 0xc;
        local_49 = 0;
        pvVar3 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::data
                           ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_18);
        pvVar4 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::data
                           ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_18);
        __a = &local_4a;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<unsigned_char_const*,void>
                  ((string *)__return_storage_ptr__,pvVar3 + 0xc,pvVar4 + 0xf,__a);
        in_ECX = (int)__a;
        std::allocator<char>::~allocator(&local_4a);
        psVar5 = systemCurrencyCode_abi_cxx11_();
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__return_storage_ptr__,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar5);
        if ((bVar1) &&
           (lVar6 = std::__cxx11::string::find_first_not_of
                              ((string *)__return_storage_ptr__,0x5275b0), lVar6 == -1)) {
          local_49 = 1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if ((local_49 & 1) == 0) {
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
      pjVar7 = (jbcoin *)
               base_uint<160UL,_jbcoin::detail::CurrencyTag>::begin
                         ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_18);
      sVar8 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::size();
      strHex<unsigned_char_const*>
                (__return_storage_ptr__,pjVar7,(uchar *)(sVar8 & 0xffffffff),in_ECX);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(Currency const& currency)
{
    // Characters we are willing to allow in the ASCII representation of a
    // three-letter currency code.
    static std::string const allowed_characters =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789"
        "<>(){}[]|?!@#$%^&*";

    if (currency == zero)
        return systemCurrencyCode();

    if (currency == noCurrency())
        return "1";

    static Currency const sIsoBits (
        from_hex_text<Currency>("FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF"));

    if ((currency & sIsoBits).isZero ())
    {
        // The offset of the 3 character ISO code in the currency descriptor
        int const isoOffset = 12;

        std::string const iso(
            currency.data () + isoOffset,
            currency.data () + isoOffset + 3);

        // Specifying the system currency code using ISO-style representation
        // is not allowed.
        if ((iso != systemCurrencyCode()) &&
            (iso.find_first_not_of (allowed_characters) == std::string::npos))
        {
            return iso;
        }
    }

    return strHex (currency.begin (), currency.size ());
}